

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDRawBufferAsyncModifyComplete(byte *finalModPos)

{
  anon_class_16_2_6885d99f fn;
  JsRef pvStack_20;
  JsErrorCode releaseStatus;
  JsValueRef releaseObj;
  byte *finalModPos_local;
  
  pvStack_20 = (JsRef)0x0;
  fn.releaseObj = &stack0xffffffffffffffe0;
  fn.finalModPos = (byte **)&releaseObj;
  releaseObj = finalModPos;
  finalModPos_local._4_4_ = ContextAPIWrapper<false,JsTTDRawBufferAsyncModifyComplete::__0>(fn);
  if (finalModPos_local._4_4_ == JsNoError) {
    if (pvStack_20 == (JsRef)0x0) {
      finalModPos_local._4_4_ = JsNoError;
    }
    else {
      finalModPos_local._4_4_ = JsRelease(pvStack_20,(uint *)0x0);
    }
  }
  return finalModPos_local._4_4_;
}

Assistant:

CHAKRA_API JsTTDRawBufferAsyncModifyComplete(_In_ byte* finalModPos)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsValueRef releaseObj = nullptr;
    JsErrorCode releaseStatus = ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        if (scriptContext->IsTTDRecordModeEnabled())
        {
            TTD::TTDPendingAsyncBufferModification pendingAsyncInfo = { 0 };
            scriptContext->TTDContextInfo->GetFromAsyncPendingList(&pendingAsyncInfo, finalModPos);

            Js::ArrayBuffer* dstBuff = Js::VarTo<Js::ArrayBuffer>(pendingAsyncInfo.ArrayBufferVar);
            releaseObj = dstBuff;

            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTRawBufferAsyncModifyComplete, pendingAsyncInfo, finalModPos);
        }

        return JsNoError;
    });

    if(releaseStatus != JsNoError)
    {
        return releaseStatus;
    }

    //We need to root release ref so we can free this in replay if needed!!!
    if(releaseObj == nullptr)
    {
        return JsNoError;
    }
    else
    {
        return JsRelease(releaseObj, nullptr);
    }

#endif
}